

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  byte bVar1;
  int iVar2;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *pBVar3;
  int *piVar4;
  bool bVar5;
  ulong uVar6;
  simplex_t sVar7;
  logic_error *this_00;
  int *piVar8;
  coefficient_t _coefficient;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  char cVar14;
  ulong uVar15;
  char cVar16;
  long lVar17;
  simplex_t sVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  
  iVar2 = this->j;
  lVar17 = (long)iVar2;
  bVar1 = this->k;
  if (iVar2 < (char)bVar1 || all_cofacets) {
    if (iVar2 < (char)bVar1) {
LAB_001325e5:
      bVar5 = false;
LAB_001326d2:
      (__return_storage_ptr__->
      super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
      )._M_payload.
      super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
      ._M_engaged = bVar5;
      return __return_storage_ptr__;
    }
    uVar15 = this->idx_below;
  }
  else {
    if ((ulong)bVar1 == 0) {
      uVar6 = 1;
    }
    else {
      uVar6 = lVar17 << ((bVar1 - 1) * (char)this->simplex_encoding->bits_per_vertex & 0x3f);
    }
    uVar15 = this->idx_below;
    if (uVar6 <= uVar15) goto LAB_001325e5;
  }
  sVar7 = this->idx_above;
  pBVar3 = this->simplex_encoding;
  lVar9 = lVar17 << 0x20;
  cVar16 = bVar1 + 1;
  lVar20 = 0;
  do {
    uVar6 = (ulong)bVar1 + lVar20;
    cVar14 = (char)uVar6;
    iVar19 = (int)lVar20;
    if (cVar14 == '\0') {
      if (uVar15 == 0) {
        uVar15 = 0;
        goto LAB_001325ef;
      }
      sVar18 = uVar15 - 1;
      this->idx_below = sVar18;
LAB_0013257b:
      lVar13 = lVar17 + lVar20 << (cVar14 * (char)pBVar3->bits_per_vertex & 0x3fU);
      uVar15 = sVar18;
    }
    else {
      uVar11 = lVar17 + lVar20 <<
               ((bVar1 + (char)lVar20 + -1) * (char)pBVar3->bits_per_vertex & 0x3f);
      sVar18 = uVar15 - uVar11;
      if (uVar15 < uVar11) {
LAB_001325ef:
        fVar22 = (this->simplex).
                 super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                 .first;
        piVar8 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar8 != piVar4) {
          iVar10 = iVar2 + iVar19;
          do {
            iVar12 = *piVar8;
            if (iVar2 + iVar19 == iVar12) {
              fVar23 = 0.0;
            }
            else {
              iVar21 = iVar12;
              if (iVar12 < iVar10) {
                iVar21 = iVar10;
              }
              if (iVar10 < iVar12) {
                iVar12 = iVar10;
              }
              fVar23 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar21][iVar12];
            }
            if (fVar23 <= fVar22) {
              fVar23 = fVar22;
            }
            fVar22 = fVar23;
            piVar8 = piVar8 + 1;
          } while (piVar8 != piVar4);
        }
        this->j = iVar2 + iVar19 + -1;
        if (cVar16 == '\0') {
          lVar17 = 1;
        }
        else {
          lVar17 = (lVar9 >> 0x20) << ((char)pBVar3->bits_per_vertex * cVar14 & 0x3fU);
        }
        iVar2 = this->parent->bits_for_coeff;
        _coefficient = (~(uint)(-1L << ((byte)iVar2 & 0x3f)) &
                       (uint)(this->simplex).
                             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                             .second.content) + 1;
        if ((uVar6 & 1) != 0) {
          _coefficient = this->parent->modulus - _coefficient;
        }
        entry_with_coeff_t::entry_with_coeff_t
                  ((entry_with_coeff_t *)
                   &(__return_storage_ptr__->
                    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
                    ._M_payload._M_value.
                    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                    .second,sVar7 + uVar15 + lVar17,_coefficient,iVar2);
        (__return_storage_ptr__->
        super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
        )._M_payload.
        super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
        ._M_payload._M_value.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
        .first = fVar22;
        bVar5 = true;
        goto LAB_001326d2;
      }
      this->idx_below = sVar18;
      if (cVar16 != '\0') goto LAB_0013257b;
      lVar13 = 1;
      uVar15 = sVar18;
    }
    sVar7 = sVar7 + lVar13;
    this->idx_above = sVar7;
    this->j = iVar19 + iVar2 + -1;
    this->k = bVar1 + (char)lVar20 + -1;
    lVar20 = lVar20 + -1;
    lVar9 = lVar9 + -0x100000000;
    cVar16 = cVar16 + -1;
    if (cVar16 == '\0') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }